

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::setupPupdate(SPxSolverBase<double> *this)

{
  ulong uVar1;
  SSVectorBase<double> *this_00;
  UpdateVector<double> *pUVar2;
  UpdateVector<double> *pUVar3;
  pointer pdVar4;
  pointer pdVar5;
  SVSetBase<double> *pSVar6;
  Item *pIVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  Nonzero<double> *pNVar11;
  int *piVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  Real RVar18;
  double dVar19;
  double dVar20;
  double local_58;
  
  pUVar2 = this->theCoPvec;
  pUVar3 = this->thePvec;
  this_00 = &pUVar3->thedelta;
  if ((pUVar2->thedelta).setupStatus == true) {
    if ((double)(int)((ulong)((long)(pUVar2->super_VectorBase<double>).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pUVar2->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3) * 0.95 <=
        (double)(pUVar2->thedelta).super_IdxSet.num) {
      (*this->multTimeColwise->_vptr_Timer[3])();
      pSVar6 = this->thevectors;
      SSVectorBase<double>::clear(this_00);
      uVar14 = (uint)((ulong)((long)(pUVar3->thedelta).super_VectorBase<double>.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pUVar3->thedelta).super_VectorBase<double>.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
      if (0 < (int)uVar14) {
        uVar16 = (ulong)(uVar14 & 0x7fffffff);
        do {
          pIVar7 = (pSVar6->set).theitem;
          iVar13 = (pSVar6->set).thekey[uVar16 - 1].idx;
          iVar9 = pIVar7[iVar13].data.super_SVectorBase<double>.memused;
          if (iVar9 < 1) {
            local_58 = 0.0;
          }
          else {
            pNVar11 = pIVar7[iVar13].data.super_SVectorBase<double>.m_elem;
            iVar9 = iVar9 + 1;
            dVar17 = 0.0;
            dVar20 = 0.0;
            do {
              dVar19 = pNVar11->val *
                       (pUVar2->thedelta).super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[pNVar11->idx];
              local_58 = dVar20 + dVar19;
              dVar17 = dVar17 + (dVar19 - (local_58 - dVar20)) +
                                (dVar20 - (local_58 - (local_58 - dVar20)));
              pNVar11 = pNVar11 + 1;
              iVar9 = iVar9 + -1;
              dVar20 = local_58;
            } while (1 < iVar9);
            local_58 = local_58 + dVar17;
          }
          uVar1 = uVar16 - 1;
          RVar18 = Tolerances::epsilon((pUVar3->thedelta)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (RVar18 < ABS(local_58)) {
            (pUVar3->thedelta).super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar1] = local_58;
            piVar12 = (pUVar3->thedelta).super_IdxSet.idx;
            iVar13 = (pUVar3->thedelta).super_IdxSet.num;
            (pUVar3->thedelta).super_IdxSet.num = iVar13 + 1;
            piVar12[iVar13] = (int)uVar1;
          }
          bVar8 = 1 < (long)uVar16;
          uVar16 = uVar1;
        } while (bVar8);
      }
      (*this->multTimeColwise->_vptr_Timer[4])();
      this->multColwiseCalls = this->multColwiseCalls + 1;
    }
    else {
      SSVectorBase<double>::assign2product4setup<double,double>
                (this_00,this->thecovectors,&pUVar2->thedelta,this->multTimeSparse,
                 this->multTimeFull,&this->multSparseCalls,&this->multFullCalls);
    }
  }
  else {
    (*this->multTimeUnsetup->_vptr_Timer[3])();
    uVar14 = (uint)((ulong)((long)(pUVar2->thedelta).super_VectorBase<double>.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(pUVar2->thedelta).super_VectorBase<double>.val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3);
    if (uVar14 == 0) {
      SSVectorBase<double>::clear(this_00);
      (pUVar2->thedelta).super_IdxSet.num = 0;
    }
    else {
      if ((int)uVar14 < 1) {
        iVar13 = 0;
      }
      else {
        pSVar6 = this->thecovectors;
        uVar16 = 0;
        iVar13 = 0;
        do {
          pdVar4 = (pUVar2->thedelta).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar20 = pdVar4[uVar16];
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            RVar18 = Tolerances::epsilon((pUVar3->thedelta)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            if (ABS(dVar20) <= RVar18) {
              pdVar4[uVar16] = 0.0;
            }
            else {
              pIVar7 = (pSVar6->set).theitem;
              iVar9 = (pSVar6->set).thekey[uVar16].idx;
              lVar15 = (long)iVar13;
              iVar13 = iVar13 + 1;
              (pUVar2->thedelta).super_IdxSet.idx[lVar15] = (int)uVar16;
              lVar15 = (long)pIVar7[iVar9].data.super_SVectorBase<double>.memused;
              if (0 < lVar15) {
                pdVar5 = (pUVar3->thedelta).super_VectorBase<double>.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar10 = lVar15 + 1;
                piVar12 = &pIVar7[iVar9].data.super_SVectorBase<double>.m_elem[lVar15 + -1].idx;
                do {
                  pdVar5[*piVar12] =
                       pdVar4[uVar16] * ((Nonzero<double> *)(piVar12 + -2))->val + pdVar5[*piVar12];
                  lVar10 = lVar10 + -1;
                  piVar12 = piVar12 + -4;
                } while (1 < lVar10);
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uVar14 & 0x7fffffff));
      }
      (pUVar2->thedelta).super_IdxSet.num = iVar13;
      (pUVar3->thedelta).setupStatus = false;
    }
    (pUVar2->thedelta).setupStatus = true;
    (*this->multTimeUnsetup->_vptr_Timer[4])();
    this->multUnsetupCalls = this->multUnsetupCalls + 1;
  }
  SSVectorBase<double>::setup(this_00);
  return;
}

Assistant:

void SPxSolverBase<R>::setupPupdate(void)
{
   SSVectorBase<R>& p = thePvec->delta();
   SSVectorBase<R>& c = theCoPvec->delta();

   if(c.isSetup())
   {
      if(c.size() < 0.95 * theCoPvec->dim())
         p.assign2product4setup(*thecovectors, c,
                                multTimeSparse, multTimeFull,
                                multSparseCalls, multFullCalls);
      else
      {
         multTimeColwise->start();
         p.assign2product(c, *thevectors);
         multTimeColwise->stop();
         ++multColwiseCalls;
      }
   }
   else
   {
      multTimeUnsetup->start();
      p.assign2productAndSetup(*thecovectors, c);
      multTimeUnsetup->stop();
      ++multUnsetupCalls;
   }

   p.setup();
}